

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_is_class
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_is_class::desc,0);
    __cxa_guard_release(&getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    iVar1 = (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,in_ESI);
    vm_val_t::set_logical(in_RDX,iVar1);
  }
  return 1;
}

Assistant:

int CVmObject::getp_is_class(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc,
                             vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* indicate whether or not we're a class object */
    retval->set_logical(is_class_object(vmg_ self));

    /* handled */
    return TRUE;
}